

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::EnsureFncScopeSlots(ByteCodeGenerator *this,ParseNode *pnode,FuncInfo *funcInfo)

{
  OpCode OVar1;
  ParseNodeBlock *pPVar2;
  ParseNodeCatch *pPVar3;
  ParseNodeFnc *pPVar4;
  ParseNodeWith *pPVar5;
  ParseNodePtr *ppPVar6;
  
  if (pnode != (ParseNode *)0x0) {
    do {
      OVar1 = pnode->nop;
      if (OVar1 < knopWith) {
        if (OVar1 == knopFncDecl) {
          pPVar4 = ParseNode::AsParseNodeFnc(pnode);
          if ((pPVar4->fncFlags & kFunctionDeclaration) != kFunctionNone) {
            pPVar4 = ParseNode::AsParseNodeFnc(pnode);
            CheckFncDeclScopeSlot(this,pPVar4,funcInfo);
          }
          pPVar4 = ParseNode::AsParseNodeFnc(pnode);
          ppPVar6 = &pPVar4->pnodeNext;
          goto LAB_00809778;
        }
        if (OVar1 == knopBlock) {
          pPVar2 = ParseNode::AsParseNodeBlock(pnode);
          ppPVar6 = &pPVar2->pnodeNext;
          goto LAB_00809778;
        }
      }
      else {
        if (OVar1 == knopWith) {
          pPVar5 = ParseNode::AsParseNodeWith(pnode);
          ppPVar6 = &pPVar5->pnodeNext;
        }
        else {
          if (OVar1 != knopCatch) goto LAB_0080977b;
          pPVar3 = ParseNode::AsParseNodeCatch(pnode);
          ppPVar6 = &pPVar3->pnodeNext;
        }
LAB_00809778:
        pnode = *ppPVar6;
      }
LAB_0080977b:
    } while (pnode != (ParseNodePtr)0x0);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EnsureFncScopeSlots(ParseNode *pnode, FuncInfo *funcInfo)
{
    while (pnode)
    {
        switch (pnode->nop)
        {
        case knopFncDecl:
            if (pnode->AsParseNodeFnc()->IsDeclaration())
            {
                this->CheckFncDeclScopeSlot(pnode->AsParseNodeFnc(), funcInfo);
            }
            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;
        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;
        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;
        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;
        }
    }
}